

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O3

void float64_suite::run(void)

{
  test_zero();
  test_one();
  test_minus_one();
  test_two();
  test_minus_two();
  test_half();
  test_minus_half();
  test_max();
  test_minus_max();
  test_min();
  fail_missing_one();
  fail_missing_two();
  fail_missing_three();
  fail_missing_four();
  fail_missing_five();
  fail_missing_six();
  fail_missing_seven();
  fail_missing_eight();
  return;
}

Assistant:

void run()
{
    test_zero();
    test_one();
    test_minus_one();
    test_two();
    test_minus_two();
    test_half();
    test_minus_half();
    test_max();
    test_minus_max();
    test_min();
    fail_missing_one();
    fail_missing_two();
    fail_missing_three();
    fail_missing_four();
    fail_missing_five();
    fail_missing_six();
    fail_missing_seven();
    fail_missing_eight();
}